

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O0

birth_stage menu_question(birth_stage current,menu_conflict *current_menu,cmd_code choice_command)

{
  uint32_t uVar1;
  void *pvVar2;
  command *pcVar3;
  ui_event uVar4;
  birth_stage local_38;
  ui_event_type uStack_34;
  birth_stage next;
  ui_event cx;
  birthmenu_data *menu_data;
  cmd_code choice_command_local;
  menu_conflict *current_menu_local;
  birth_stage current_local;
  
  pvVar2 = menu_priv(current_menu);
  local_38 = BIRTH_RESET;
  clear_question();
  Term_putstr(L'\x02',L'\a',L'\xffffffff',L'\v',*(char **)((long)pvVar2 + 8));
  current_menu->cmd_keys = "?=*@\x18";
  while (local_38 == BIRTH_RESET) {
    *(birth_stage *)((long)pvVar2 + 0x14) = current;
    uVar4 = menu_select(current_menu,1,false);
    uStack_34 = uVar4.type;
    if (uStack_34 == EVT_ESCAPE) {
      local_38 = BIRTH_BACK;
    }
    else if (uStack_34 == EVT_SELECT) {
      if (current == BIRTH_ROLLER_CHOICE) {
        if (current_menu->cursor == 0) {
          point_based_start();
          cmdq_push(CMD_RESET_STATS);
          pcVar3 = cmdq_peek();
          cmd_set_arg_choice(pcVar3,"choice",L'\x01');
          local_38 = BIRTH_POINTBASED;
        }
        else {
          cmdq_push(CMD_ROLL_STATS);
          local_38 = BIRTH_ROLLER;
        }
      }
      else {
        cmdq_push(choice_command);
        pcVar3 = cmdq_peek();
        cmd_set_arg_choice(pcVar3,"choice",current_menu->cursor);
        local_38 = current + BIRTH_QUICKSTART;
      }
    }
    else if (uStack_34 == EVT_SWITCH) {
      local_38 = *(birth_stage *)((long)pvVar2 + 0x14);
    }
    else if (uStack_34 == EVT_KBRD) {
      next = uVar4.key.code;
      if ((next == 0x2a) && ((*(byte *)((long)pvVar2 + 0x10) & 1) != 0)) {
        uVar1 = Rand_div(current_menu->count);
        current_menu->cursor = uVar1;
        cmdq_push(choice_command);
        pcVar3 = cmdq_peek();
        cmd_set_arg_choice(pcVar3,"choice",current_menu->cursor);
        menu_refresh(current_menu,false);
        local_38 = current + BIRTH_QUICKSTART;
      }
      else if (next == 0x3d) {
        do_cmd_options_birth();
        local_38 = current;
      }
      else if (next == 0x40) {
        finish_with_random_choices(current);
        local_38 = BIRTH_FINAL_CONFIRM;
      }
      else if (next == 0x18) {
        quit((char *)0x0);
      }
      else if (next == 0x3f) {
        do_cmd_help();
      }
    }
  }
  return local_38;
}

Assistant:

static enum birth_stage menu_question(enum birth_stage current,
									  struct menu *current_menu,
									  cmd_code choice_command)
{
	struct birthmenu_data *menu_data = menu_priv(current_menu);
	ui_event cx;

	enum birth_stage next = BIRTH_RESET;
	
	/* Print the question currently being asked. */
	clear_question();
	Term_putstr(QUESTION_COL, QUESTION_ROW, -1, COLOUR_YELLOW, menu_data->hint);

	current_menu->cmd_keys = "?=*@\x18";	 /* ?, =, *, @, <ctl-X> */

	while (next == BIRTH_RESET) {
		/* Display the menu, wait for a selection of some sort to be made. */
		menu_data->stage_inout = current;
		cx = menu_select(current_menu, EVT_KBRD, false);

		/* As all the menus are displayed in "hierarchical" style, we allow
		   use of "back" (left arrow key or equivalent) to step back in 
		   the proces as well as "escape". */
		if (cx.type == EVT_ESCAPE) {
			next = BIRTH_BACK;
		} else if (cx.type == EVT_SELECT) {
			if (current == BIRTH_ROLLER_CHOICE) {
				if (current_menu->cursor) {
					/* Do a first roll of the stats */
					cmdq_push(CMD_ROLL_STATS);
					next = current + 2;
				} else {
					/* 
					 * Make sure we've got a point-based char to play with. 
					 * We call point_based_start here to make sure we get
					 * an update on the points totals before trying to
					 * display the screen.  The call to CMD_RESET_STATS
					 * forces a rebuying of the stats to give us up-to-date
					 * totals.  This is, it should go without saying, a hack.
					 */
					point_based_start();
					cmdq_push(CMD_RESET_STATS);
					cmd_set_arg_choice(cmdq_peek(), "choice", true);
					next = current + 1;
				}
			} else {
				cmdq_push(choice_command);
				cmd_set_arg_choice(cmdq_peek(), "choice", current_menu->cursor);
				next = current + 1;
			}
		} else if (cx.type == EVT_SWITCH) {
			next = menu_data->stage_inout;
		} else if (cx.type == EVT_KBRD) {
			/* '*' chooses an option at random from those the game's provided */
			if (cx.key.code == '*' && menu_data->allow_random) {
				current_menu->cursor = randint0(current_menu->count);
				cmdq_push(choice_command);
				cmd_set_arg_choice(cmdq_peek(), "choice", current_menu->cursor);

				menu_refresh(current_menu, false);
				next = current + 1;
			} else if (cx.key.code == '=') {
				do_cmd_options_birth();
				next = current;
			} else if (cx.key.code == '@') {
				/*
				 * Use random choices to complete the character.
				 */
				finish_with_random_choices(current);
				next = BIRTH_FINAL_CONFIRM;
			} else if (cx.key.code == KTRL('X')) {
				quit(NULL);
			} else if (cx.key.code == '?') {
				do_cmd_help();
			}
		}
	}
	
	return next;
}